

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,Plugin *plugin)

{
  pointer pMVar1;
  bool bVar2;
  reference pMVar3;
  reference pEVar4;
  reference pFVar5;
  char *pcVar6;
  int *in_R9;
  string_view full_name;
  string_view full_name_00;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  upb_FileDef *local_278;
  string local_270;
  string_view local_250;
  undefined8 local_240;
  upb_FileDef *local_238;
  undefined1 local_230 [8];
  Output output_2;
  FieldDefPtr ext;
  iterator __end2_2;
  iterator __begin2_2;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__range2_2;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  upb_FileDef *local_1d0;
  string local_1c8;
  string_view local_1a8;
  undefined8 local_198;
  upb_FileDef *local_190;
  undefined1 local_188 [8];
  Output output_1;
  EnumDefPtr e;
  iterator __end2_1;
  iterator __begin2_1;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__range2_1;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  upb_FileDef *local_128;
  string local_120;
  string_view local_100;
  undefined8 local_f0;
  upb_FileDef *local_e8;
  undefined1 local_e0 [8];
  Output output;
  MessageDefPtr message;
  iterator __end2;
  iterator __begin2;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__range2;
  FileDefPtr FStack_98;
  int i;
  undefined1 local_90 [8];
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  undefined1 local_60 [8];
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  undefined1 local_40 [8];
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  Plugin *plugin_local;
  MiniTableOptions *options_local;
  DefPoolPair *pools_local;
  FileDefPtr file_local;
  
  extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)file.ptr_;
  messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)plugin;
  SortedMessages((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_40,file);
  SortedExtensions((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_60,file);
  FStack_98.ptr_ = file.ptr_;
  SortedEnums((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90,file,
              kClosedEnums);
  __range2._4_4_ = 0;
  __end2 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::begin
                     ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_40);
  message.ptr_ = (upb_MessageDef *)
                 std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::end
                           ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                            local_40);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
                                *)&message);
    if (!bVar2) break;
    pMVar3 = __gnu_cxx::
             __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
             ::operator*(&__end2);
    output.output_.field_2._8_8_ = pMVar3->ptr_;
    Output::Output((Output *)local_e0);
    local_e8 = file.ptr_;
    WriteMiniTableSourceIncludes
              ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)local_e0,
               (Output *)plugin);
    local_f0 = output.output_.field_2._8_8_;
    anon_unknown_3::WriteMessage
              ((MessageDefPtr)output.output_.field_2._8_8_,pools,options,(Output *)local_e0);
    pMVar1 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_128 = file.ptr_;
    pcVar6 = MessageDefPtr::full_name((MessageDefPtr *)((long)&output.output_.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,pcVar6);
    sVar7._M_str = (char *)((long)&__range2 + 4);
    sVar7._M_len = (size_t)local_138._M_str;
    MultipleSourceFilename_abi_cxx11_
              (&local_120,(generator *)local_128,(FileDefPtr)local_138._M_len,sVar7,in_R9);
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120);
    local_100 = sVar7;
    sVar7 = Output::output((Output *)local_e0);
    plugin = (Plugin *)sVar7._M_len;
    Plugin::AddOutputFile((Plugin *)pMVar1,local_100,sVar7);
    std::__cxx11::string::~string((string *)&local_120);
    Output::~Output((Output *)local_e0);
    __gnu_cxx::
    __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::begin
                       ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90);
  e.ptr_ = (upb_EnumDef *)
           std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::end
                     ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
                        *)&e);
    if (!bVar2) break;
    pEVar4 = __gnu_cxx::
             __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
             ::operator*(&__end2_1);
    output_1.output_.field_2._8_8_ = pEVar4->ptr_;
    Output::Output((Output *)local_188);
    local_190 = file.ptr_;
    WriteMiniTableSourceIncludes
              ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)local_188,
               (Output *)plugin);
    local_198 = output_1.output_.field_2._8_8_;
    anon_unknown_3::WriteEnum((EnumDefPtr)output_1.output_.field_2._8_8_,(Output *)local_188);
    pMVar1 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d0 = file.ptr_;
    pcVar6 = EnumDefPtr::full_name((EnumDefPtr *)((long)&output_1.output_.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,pcVar6);
    full_name._M_str = (char *)((long)&__range2 + 4);
    full_name._M_len = (size_t)local_1e0._M_str;
    MultipleSourceFilename_abi_cxx11_
              (&local_1c8,(generator *)local_1d0,(FileDefPtr)local_1e0._M_len,full_name,in_R9);
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1c8);
    local_1a8 = sVar7;
    sVar7 = Output::output((Output *)local_188);
    plugin = (Plugin *)sVar7._M_len;
    Plugin::AddOutputFile((Plugin *)pMVar1,local_1a8,sVar7);
    std::__cxx11::string::~string((string *)&local_1c8);
    Output::~Output((Output *)local_188);
    __gnu_cxx::
    __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin
                       ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_60);
  ext.ptr_ = (upb_FieldDef *)
             std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end
                       ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_60);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
                        *)&ext);
    if (!bVar2) break;
    pFVar5 = __gnu_cxx::
             __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
             ::operator*(&__end2_2);
    output_2.output_.field_2._8_8_ = pFVar5->ptr_;
    Output::Output((Output *)local_230);
    local_238 = file.ptr_;
    WriteMiniTableSourceIncludes
              ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)local_230,
               (Output *)plugin);
    local_240 = output_2.output_.field_2._8_8_;
    anon_unknown_3::WriteExtension
              (pools,(FieldDefPtr)output_2.output_.field_2._8_8_,(Output *)local_230);
    pMVar1 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_278 = file.ptr_;
    pcVar6 = FieldDefPtr::full_name((FieldDefPtr *)((long)&output_2.output_.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_288,pcVar6);
    full_name_00._M_str = (char *)((long)&__range2 + 4);
    full_name_00._M_len = (size_t)local_288._M_str;
    MultipleSourceFilename_abi_cxx11_
              (&local_270,(generator *)local_278,(FileDefPtr)local_288._M_len,full_name_00,in_R9);
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_270);
    local_250 = sVar7;
    sVar7 = Output::output((Output *)local_230);
    plugin = (Plugin *)sVar7._M_len;
    Plugin::AddOutputFile((Plugin *)pMVar1,local_250,sVar7);
    std::__cxx11::string::~string((string *)&local_270);
    Output::~Output((Output *)local_230);
    __gnu_cxx::
    __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
    ::operator++(&__end2_2);
  }
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::~vector
            ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~vector
            ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_60);
  std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::~vector
            ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_40);
  return;
}

Assistant:

void WriteMiniTableMultipleSources(const DefPoolPair& pools,
                                   upb::FileDefPtr file,
                                   const MiniTableOptions& options,
                                   Plugin* plugin) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, message.full_name(), &i),
                          output.output());
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, e.full_name(), &i),
                          output.output());
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, ext.full_name(), &i),
                          output.output());
  }
}